

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidselect.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  pointer pHVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  Header *pHVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 *puVar13;
  undefined8 *puVar14;
  char *pcVar15;
  int *piVar16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var18;
  mapped_type *pmVar19;
  CompressedIDManifest *pCVar20;
  pointer pvVar21;
  int outputSample;
  ulong uVar22;
  int x;
  size_type __n;
  ulong uVar23;
  pointer pvVar24;
  _List_node_base *p_Var25;
  _List_node_base *p_Var26;
  long lVar27;
  int i;
  int h;
  uint uVar28;
  long lVar29;
  size_type sVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  int local_268;
  size_type local_250;
  long local_248;
  int local_22c;
  int local_228;
  _Rb_tree_color local_224;
  DeepScanLineInputPart inPart;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> hdrs;
  MultiPartOutputFile output;
  MultiPartInputFile input;
  char **local_1c8;
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  ids;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  scanLine;
  vector<int,_std::allocator<int>_> pixelCounts;
  vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
  scanPointers;
  FrameBuffer outBuf;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> outputAlpha;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  channelToPos;
  IDManifest mfst;
  DeepFrameBuffer buf;
  DeepScanLineOutputPart outPart;
  
  if (argc < 4) {
    poVar11 = std::operator<<((ostream *)&std::cerr,
                              "syntax: [--mask] input.exr match [match...] [--and match [match...]] output.exr\n"
                             );
    poVar11 = std::operator<<(poVar11,
                              " if --mask specified, writes a shallow EXR with a mask of the selected object(s) in the \'A\' channel\n"
                             );
    poVar11 = std::operator<<(poVar11,
                              " otherwise, writes a deep EXR only containing the selected object(s)\n"
                             );
    poVar11 = std::operator<<(poVar11,'\n');
    poVar11 = std::operator<<(poVar11," matches can be:\n");
    poVar11 = std::operator<<(poVar11,"   searchstring - match any component of any channel\n");
    poVar11 = std::operator<<(poVar11,"   componentname:searchstring - only match given component\n"
                             );
    poVar11 = std::operator<<(poVar11,
                              "   channelname:number - match specified numeric ID in given channel\n"
                             );
    poVar11 = std::operator<<(poVar11,'\n');
    poVar11 = std::operator<<(poVar11,
                              "\"A B --and C D\" means \"(must match either A or B) and also (must match either C or D)\"\n"
                             );
    poVar11 = std::operator<<(poVar11," e.g:\n");
    poVar11 = std::operator<<(poVar11,"  input.deep.exr blue output.deep.exr\n");
    poVar11 = std::operator<<(poVar11,
                              "  input.deep.exr material:blue --and model:blob output.deep.exr\n");
    poVar11 = std::operator<<(poVar11,
                              "  input.deep.exr material:blue material:red --and model:blob output.deep.exr\n"
                             );
    std::operator<<(poVar11,"  input.deep.exr particleid:3 output.deep.exr\n");
    return 1;
  }
  pcVar15 = argv[1];
  iVar7 = strcmp(pcVar15,"--mask");
  if (iVar7 == 0) {
    local_22c = argc + -3;
    local_1c8 = argv + 3;
    pcVar15 = argv[2];
  }
  else {
    local_22c = argc + -2;
    local_1c8 = argv + 2;
  }
  iVar8 = Imf_3_4::globalThreadCount();
  iVar10 = 1;
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(&input,pcVar15,iVar8,true);
  pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
  cVar5 = Imf_3_4::hasIDManifest(pHVar12);
  if (cVar5 == '\0') {
    std::operator<<((ostream *)&std::cerr,"deepidselect requires an ID manifest in the EXR header\n"
                   );
  }
  else {
    iVar8 = 0;
    do {
      iVar9 = Imf_3_4::MultiPartInputFile::parts();
      if (iVar9 <= iVar8) {
        iVar10 = Imf_3_4::MultiPartInputFile::parts();
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
                  (&hdrs,(long)iVar10,(allocator_type *)&buf);
        if (iVar7 == 0) {
          lVar27 = 0;
          for (lVar29 = 0; iVar10 = Imf_3_4::MultiPartInputFile::parts(), lVar29 < iVar10;
              lVar29 = lVar29 + 1) {
            Imf_3_4::MultiPartInputFile::header((int)&input);
            puVar13 = (undefined8 *)Imf_3_4::Header::dataWindow();
            puVar14 = (undefined8 *)Imf_3_4::Header::dataWindow();
            *puVar14 = *puVar13;
            puVar14[1] = puVar13[1];
            Imf_3_4::Header::setType
                      ((string *)
                       (hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar27));
            puVar13 = (undefined8 *)Imf_3_4::Header::displayWindow();
            puVar14 = (undefined8 *)Imf_3_4::Header::displayWindow();
            *puVar14 = *puVar13;
            puVar14[1] = puVar13[1];
            cVar5 = Imf_3_4::Header::hasView();
            pHVar3 = hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (cVar5 != '\0') {
              Imf_3_4::Header::view_abi_cxx11_();
              Imf_3_4::Header::setView((string *)(pHVar3 + lVar27));
            }
            cVar5 = Imf_3_4::Header::hasName();
            pHVar3 = hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (cVar5 != '\0') {
              Imf_3_4::Header::name_abi_cxx11_();
              Imf_3_4::Header::setName((string *)(pHVar3 + lVar27));
            }
            pcVar15 = (char *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel((Channel *)&buf,HALF,1,1,false);
            Imf_3_4::ChannelList::insert(pcVar15,(Channel *)"A");
            lVar27 = lVar27 + 0x38;
          }
        }
        else {
          lVar27 = 0;
          for (lVar29 = 0; iVar10 = Imf_3_4::MultiPartInputFile::parts(), lVar29 < iVar10;
              lVar29 = lVar29 + 1) {
            pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
            Imf_3_4::Header::operator=
                      (hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar27,pHVar12);
            lVar27 = lVar27 + 0x38;
          }
        }
        pcVar15 = argv[(ulong)(uint)argc - 1];
        iVar10 = Imf_3_4::MultiPartInputFile::parts();
        iVar8 = Imf_3_4::globalThreadCount();
        Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                  (&output,pcVar15,
                   hdrs.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                   _M_impl.super__Vector_impl_data._M_start,iVar10,false,iVar8);
        local_268 = 0;
        while( true ) {
          iVar10 = Imf_3_4::MultiPartInputFile::parts();
          if (iVar10 <= local_268) break;
          pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
          Imf_3_4::Header::channels();
          piVar16 = (int *)Imf_3_4::Header::dataWindow();
          iVar10 = *piVar16;
          iVar8 = piVar16[1];
          iVar9 = piVar16[2];
          iVar1 = piVar16[3];
          channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &channelToPos._M_t._M_impl.super__Rb_tree_header._M_header;
          channelToPos._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               channelToPos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var17 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
          uVar28 = (iVar9 - iVar10) + 1;
          uVar22 = (ulong)uVar28;
          local_250 = 0;
          local_228 = -1;
          local_224 = _S_black;
          while (p_Var18 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end(), p_Var17 != p_Var18) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&buf,(char *)(p_Var17 + 1),(allocator<char> *)&outPart);
            pmVar19 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](&channelToPos,(key_type *)&buf);
            *pmVar19 = (mapped_type)local_250;
            std::__cxx11::string::~string((string *)&buf);
            if (((char)p_Var17[1]._M_color == 0x41) &&
               (*(byte *)((long)&p_Var17[1]._M_color + 1) == 0)) {
              local_224 = p_Var17[9]._M_color;
              local_228 = (mapped_type)local_250;
            }
            p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
            local_250 = local_250 + 1;
          }
          Imf_3_4::hasIDManifest(pHVar12);
          ids.
          super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ids;
          ids.
          super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
          ._M_impl._M_node._M_size = 0;
          ids.
          super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               ids.
               super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
          pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
          pCVar20 = (CompressedIDManifest *)Imf_3_4::idManifest(pHVar12);
          Imf_3_4::IDManifest::IDManifest(&mfst,pCVar20);
          setIds(&mfst,&ids,local_1c8,local_22c,&channelToPos);
          std::
          vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
          ::vector(&scanLine,local_250,(allocator_type *)&buf);
          std::
          vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
          ::vector(&scanPointers,local_250,(allocator_type *)&buf);
          __n = (size_type)(int)uVar28;
          lVar27 = 0;
          sVar30 = local_250;
          while (bVar6 = sVar30 != 0, sVar30 = sVar30 - 1, bVar6) {
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)((long)&((scanLine.
                                  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar27),__n);
            std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::resize
                      ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)
                       ((long)&((scanPointers.
                                 super__Vector_base<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar27),__n);
            lVar27 = lVar27 + 0x18;
          }
          std::vector<int,_std::allocator<int>_>::vector(&pixelCounts,__n,(allocator_type *)&buf);
          std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
                    (&outputAlpha,__n,(allocator_type *)&buf);
          Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(&buf);
          Imf_3_4::Slice::Slice
                    ((Slice *)&outPart,UINT,
                     (char *)((long)pixelCounts.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start - (long)iVar10),4,0,1,1
                     ,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&buf);
          p_Var17 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
          lVar27 = -(long)iVar10;
          local_248 = 0;
          while (p_Var18 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end(), p_Var17 != p_Var18) {
            Imf_3_4::DeepSlice::DeepSlice
                      ((DeepSlice *)&outPart,p_Var17[9]._M_color,
                       (char *)(*(long *)((long)&((scanPointers.
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>
                                                 )._M_impl.super__Vector_impl_data._M_start +
                                         local_248) + lVar27),8,0,4,1,1,0.0,false,false);
            Imf_3_4::DeepFrameBuffer::insert((char *)&buf,(DeepSlice *)(p_Var17 + 1));
            p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
            local_248 = local_248 + 0x18;
          }
          Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart(&inPart,&input,local_268);
          Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)&inPart);
          if (iVar7 == 0) {
            outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
            outBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 outBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            Imf_3_4::Slice::Slice
                      ((Slice *)&outPart,HALF,
                       (char *)(lVar27 + (long)outputAlpha.
                                               super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                               ._M_impl.super__Vector_impl_data._M_start),2,0,1,1,
                       0.0,false,false);
            Imf_3_4::FrameBuffer::insert((char *)&outBuf,(Slice *)"A");
            Imf_3_4::OutputPart::OutputPart((OutputPart *)&outPart,&output,local_268);
            Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&outPart);
            std::
            _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                         *)&outBuf);
          }
          else {
            Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart(&outPart,&output,local_268);
            Imf_3_4::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)&outPart);
          }
          if ((int)uVar28 < 1) {
            uVar22 = 0;
          }
          for (; iVar8 <= iVar1; iVar8 = iVar8 + 1) {
            Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)&inPart);
            for (sVar30 = 0; local_250 != sVar30; sVar30 = sVar30 + 1) {
              lVar27 = 0;
              for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           ((long)&((scanLine.
                                     super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[sVar30].
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data + lVar27),
                           (long)pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar23]);
                scanPointers.
                super__Vector_base<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[sVar30].
                super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar23] =
                     *(uint **)((long)&((scanLine.
                                         super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[sVar30].
                                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data + lVar27);
                lVar27 = lVar27 + 0x18;
              }
            }
            Imf_3_4::DeepScanLineInputPart::readPixels((int)&inPart);
            for (uVar23 = 0; lVar27 = _imath_half_to_float_table, uVar23 != uVar22;
                uVar23 = uVar23 + 1) {
              pvVar21 = scanLine.
                        super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + local_228;
              fVar32 = 0.0;
              iVar10 = 0;
              fVar31 = 0.0;
              for (lVar29 = 0;
                  lVar29 < pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar23]; lVar29 = lVar29 + 1) {
                bVar6 = true;
                p_Var25 = (_List_node_base *)&ids;
                while ((p_Var25 = (((_List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                                     *)&p_Var25->_M_next)->_M_impl)._M_node.super__List_node_base.
                                  _M_next, p_Var25 != (_List_node_base *)&ids && (bVar6))) {
                  p_Var26 = p_Var25 + 1;
                  bVar4 = false;
                  while ((bVar6 = bVar4, p_Var26 = p_Var26->_M_next, p_Var26 != p_Var25 + 1 &&
                         (!bVar6))) {
                    bVar4 = bVar6;
                    if (*(int *)(*(long *)&scanLine.
                                           super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [*(int *)&p_Var26[1]._M_next].
                                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar23].
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data + lVar29 * 4) ==
                        *(int *)((long)(p_Var26 + 1) + 4)) {
                      bVar4 = true;
                      if (((long)*(int *)((long)(p_Var26 + 1) + 8) != -1) &&
                         (bVar4 = bVar6,
                         *(int *)(*(long *)&scanLine.
                                            super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [*(int *)((long)(p_Var26 + 1) + 8)].
                                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar23].
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data + lVar29 * 4) ==
                         *(int *)((long)(p_Var26 + 1) + 0xc))) {
                        bVar4 = true;
                      }
                    }
                  }
                }
                if (iVar7 == 0) {
                  if (local_224 == _S_red) {
                    fVar33 = (float)*(uint *)(*(long *)&(pvVar21->
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar23]
                                                  .
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + lVar29 * 4);
                  }
                  else if (local_224 == _S_black) {
                    fVar33 = *(float *)(lVar27 + (ulong)*(ushort *)
                                                         (*(long *)&(pvVar21->
                                                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar23]
                                                  .
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + lVar29 * 4) * 4
                                       );
                  }
                  else {
                    fVar33 = 0.0;
                    if (local_224 == 2) {
                      fVar33 = *(float *)(*(long *)&(pvVar21->
                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar23]
                                                  .
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + lVar29 * 4);
                    }
                  }
                  fVar33 = fVar33 * (1.0 - fVar32);
                  if (bVar6) {
                    fVar31 = fVar31 + fVar33;
                  }
                  fVar32 = fVar33 + fVar32;
                }
                else if (bVar6) {
                  pvVar24 = scanLine.
                            super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  sVar30 = local_250;
                  while (bVar6 = sVar30 != 0, sVar30 = sVar30 - 1, bVar6) {
                    lVar2 = *(long *)&(pvVar24->
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar23].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data;
                    *(undefined4 *)(lVar2 + (long)iVar10 * 4) = *(undefined4 *)(lVar2 + lVar29 * 4);
                    pvVar24 = pvVar24 + 1;
                  }
                  iVar10 = iVar10 + 1;
                }
              }
              if (iVar7 == 0) {
                Imath_3_2::half::operator=
                          (outputAlpha.
                           super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar23,
                           (float)(~-(uint)(0.0 < fVar32) & (uint)fVar31 |
                                  (uint)(fVar31 / fVar32) & -(uint)(0.0 < fVar32)));
              }
              else {
                pixelCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar23] = iVar10;
              }
            }
            iVar10 = (int)(DeepFrameBuffer *)&outPart;
            if (iVar7 == 0) {
              Imf_3_4::OutputPart::OutputPart((OutputPart *)&outPart,&output,local_268);
              Imf_3_4::OutputPart::writePixels(iVar10);
            }
            else {
              Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart(&outPart,&output,local_268);
              Imf_3_4::DeepScanLineOutputPart::writePixels(iVar10);
            }
          }
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                       *)&buf);
          std::_Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~_Vector_base
                    (&outputAlpha.
                      super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&pixelCounts.super__Vector_base<int,_std::allocator<int>_>);
          std::
          vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
          ::~vector(&scanPointers);
          std::
          vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
          ::~vector(&scanLine);
          std::
          vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
          ::~vector((vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                     *)&mfst);
          std::__cxx11::
          _List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
          ::_M_clear(&ids.
                      super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                    );
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~_Rb_tree(&channelToPos._M_t);
          local_268 = local_268 + 1;
        }
        Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&output);
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&hdrs);
        iVar10 = 0;
        goto LAB_00105360;
      }
      Imf_3_4::MultiPartInputFile::header((int)&input);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Imf_3_4::Header::type_abi_cxx11_();
      bVar6 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
      iVar8 = iVar8 + 1;
    } while (!bVar6);
    std::operator<<((ostream *)&std::cerr,
                    "deepidselect currently only supports files which are entirely deep scanline files\n"
                   );
  }
LAB_00105360:
  Imf_3_4::MultiPartInputFile::~MultiPartInputFile(&input);
  return iVar10;
}

Assistant:

int
main (int argc, const char* argv[])
{
    if (argc < 4)
    {
        cerr
            << "syntax: [--mask] input.exr match [match...] [--and match [match...]] output.exr\n"
            << " if --mask specified, writes a shallow EXR with a mask of the selected object(s) in the 'A' channel\n"
            << " otherwise, writes a deep EXR only containing the selected object(s)\n"
            << '\n'
            << " matches can be:\n"
            << "   searchstring - match any component of any channel\n"
            << "   componentname:searchstring - only match given component\n"
            << "   channelname:number - match specified numeric ID in given channel\n"
            << '\n'
            << "\"A B --and C D\" means \"(must match either A or B) and also (must match either C or D)\"\n"
            << " e.g:\n"
            << "  input.deep.exr blue output.deep.exr\n"
            << "  input.deep.exr material:blue --and model:blob output.deep.exr\n"
            << "  input.deep.exr material:blue material:red --and model:blob output.deep.exr\n"
            << "  input.deep.exr particleid:3 output.deep.exr\n";
        return 1;
    }

    bool         mask              = false;
    int          numMatchArguments = argc - 2;
    const char** matchArguments    = argv + 2;
    const char*  inputFile         = argv[1];
    if (strcmp (argv[1], "--mask") == 0)
    {
        mask = true;
        numMatchArguments--;
        matchArguments++;
        inputFile = argv[2];
    }

    MultiPartInputFile input (inputFile);

    if (!hasIDManifest (input.header (0)))
    {
        cerr << "deepidselect requires an ID manifest in the EXR header\n";
        return 1;
    }

    for (int i = 0; i < input.parts (); ++i)
    {
        if (input.header (i).type () != DEEPSCANLINE)
        {
            cerr
                << "deepidselect currently only supports files which are entirely deep scanline files\n";
            return 1;
        }
    }

    //
    // build output headers. For deep output, this is easy: just copy them over
    // for masks, build scanline images of the same dimensions, each with a single alpha channel
    //
    vector<Header> hdrs (input.parts ());
    if (mask)
    {
        for (int h = 0; h < input.parts (); ++h)
        {
            const Header& inHdr   = input.header (h);
            hdrs[h].dataWindow () = inHdr.dataWindow ();
            hdrs[h].setType (SCANLINEIMAGE);
            hdrs[h].displayWindow () = inHdr.displayWindow ();
            if (inHdr.hasView ()) { hdrs[h].setView (inHdr.view ()); }
            if (inHdr.hasName ()) { hdrs[h].setName (inHdr.name ()); }
            hdrs[h].channels ().insert ("A", Channel (HALF));
        }
    }
    else
    {
        for (int h = 0; h < input.parts (); ++h)
        {
            hdrs[h] = input.header (h);
        }
    }

    MultiPartOutputFile output (argv[argc - 1], hdrs.data (), input.parts ());

    // process each part individually

    for (int pt = 0; pt < input.parts (); ++pt)
    {
        const Header&      inputHeader = input.header (pt);
        const ChannelList& inputChans  = inputHeader.channels ();
        Box2i              dataWindow  = inputHeader.dataWindow ();
        int                width = dataWindow.max.x + 1 - dataWindow.min.x;

        map<string, int>
            channelToPos; // index of each channel as stored in scanLine object

        int       alphaChannel     = -1;
        PixelType alphaChannelType = HALF;

        int channels = 0;
        for (ChannelList::ConstIterator i = inputChans.begin ();
             i != inputChans.end ();
             ++i)
        {
            channelToPos[i.name ()] = channels;
            if (strcmp (i.name (), "A") == 0)
            {
                alphaChannel     = channels;
                alphaChannelType = i.channel ().type;
            }
            channels++;
        }

        // if the part has a manifest, use this part's manifest
        // otherwise use part 0's manifest.
        // (but reparse the manifest for every part in case the channel list has changed)
        //
        int               manifestPart = hasIDManifest (inputHeader) ? pt : 0;
        list<list<match>> ids;
        IDManifest        mfst = idManifest (input.header (manifestPart));

        setIds (mfst, ids, matchArguments, numMatchArguments, channelToPos);

        // store for an individual deep scanline. Accessed using scanLine[channelIndex][pixelIndex][sampleIndex]
        // where pixelIndex is 0 for the leftmost pixel (even if the dataWindow doesn't start at 0)
        vector<vector<vector<uint32_t>>> scanLine (channels);

        // pointers to the data in each channel for FrameBuffer
        vector<vector<uint32_t*>> scanPointers (channels);

        for (int i = 0; i < channels; ++i)
        {
            scanLine[i].resize (width);
            scanPointers[i].resize (width);
        }

        vector<int>  pixelCounts (width);
        vector<half> outputAlpha (
            width); // only required for --mask mode: stores output

        DeepFrameBuffer buf;
        buf.insertSampleCountSlice (Slice (
            UINT,
            (char*) pixelCounts.data () - dataWindow.min.x,
            sizeof (int),
            0));
        int c = 0;

        //
        // read all channels as their native type, so they round trip when writing deep
        //
        for (ChannelList::ConstIterator i = inputChans.begin ();
             i != inputChans.end ();
             ++i, ++c)
        {
            buf.insert (
                i.name (),
                DeepSlice (
                    i.channel ().type,
                    (char*) scanPointers[c].data () - dataWindow.min.x,
                    sizeof (char*),
                    0,
                    sizeof (int32_t)));
        }

        DeepScanLineInputPart inPart (input, pt);
        inPart.setFrameBuffer (buf);

        //
        // for mask, create an alpha channel and initialize a FrameBuffer with that data
        // otherwise, can use the deep frame buffer for both input and output, since the data is processed in-place
        //
        if (mask)
        {
            FrameBuffer outBuf;
            outBuf.insert (
                "A",
                Slice (
                    HALF,
                    (char*) outputAlpha.data () - dataWindow.min.x,
                    sizeof (half),
                    0));
            OutputPart outPart (output, pt);
            outPart.setFrameBuffer (outBuf);
        }
        else
        {
            DeepScanLineOutputPart outPart (output, pt);
            outPart.setFrameBuffer (buf);
        }

        for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
        {
            inPart.readPixelSampleCounts (y);
            for (int c = 0; c < channels; ++c)
            {
                for (int x = 0; x < width; ++x)
                {
                    scanLine[c][x].resize (pixelCounts[x]);
                    scanPointers[c][x] = scanLine[c][x].data ();
                }
            }

            inPart.readPixels (y);

            for (int x = 0; x < width; ++x)
            {
                int outputSample = 0;

                float totalAlpha = 0.f;
                float maskAlpha  = 0.f;

                for (int s = 0; s < pixelCounts[x]; ++s)
                {
                    //
                    // should sample s be retained?
                    // look for an entry in each 'and group' where all the required channels match their
                    // corresponding values
                    //

                    bool good = true;
                    for (list<list<match>>::const_iterator idGroup =
                             ids.begin ();
                         idGroup != ids.end () && good;
                         ++idGroup)
                    {
                        good = false;
                        for (list<match>::const_iterator i = idGroup->begin ();
                             i != idGroup->end () && !good;
                             ++i)
                        {
                            if (scanLine[i->channel1][x][s] == i->id1 &&
                                (i->channel2 == -1 ||
                                 scanLine[i->channel2][x][s] == i->id2))
                            {
                                good = true;
                            }
                        }
                    }

                    //
                    // deep output mode:
                    //   delete unwanted samples
                    // mask output node:
                    //   composite together wanted sample's alpha
                    //

                    if (mask)
                    {
                        //cast alpha to float, and composite
                        float alpha = 0.f;
                        switch (alphaChannelType)
                        {
                            case FLOAT:
                                alpha = *(float*) (&scanLine[alphaChannel][x]
                                                        .data ()[s]);
                                break;
                            case HALF:
                                alpha = *(half*) (&scanLine[alphaChannel][x]
                                                       .data ()[s]);
                                break;
                            case UINT:
                                alpha = scanLine[alphaChannel][x][s];
                                break; //wat! this is a weird thing to do,but whatever...
                            case NUM_PIXELTYPES: break;
                        }

                        if (good) { maskAlpha += (1.0 - totalAlpha) * alpha; }
                        totalAlpha += (1.0 - totalAlpha) * alpha;
                    }

                    else if (good)
                    {
                        // keep Sample: copy from original position into output position
                        // (so overwrite any samples that are to be deleted)
                        for (int c = 0; c < channels; ++c)
                        {
                            scanLine[c][x][outputSample] = scanLine[c][x][s];
                        }
                        outputSample++;
                    }
                }

                if (mask)
                {
                    if (totalAlpha > 0.f) { maskAlpha /= totalAlpha; }
                    outputAlpha[x] = maskAlpha;
                }
                else
                {
                    // update total count of samples
                    pixelCounts[x] = outputSample;
                }
            }

            //
            // write data out
            //
            if (mask)
            {
                OutputPart outPart (output, pt);
                outPart.writePixels (1);
            }
            else
            {
                DeepScanLineOutputPart outPart (output, pt);
                outPart.writePixels (1);
            }
        }
    }
}